

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetObjectsNode::Evaluate
          (string *__return_storage_ptr__,TargetObjectsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  iterator this_00;
  char *pcVar1;
  byte bVar2;
  TargetType TVar3;
  const_reference pvVar4;
  cmGeneratorTarget *this_01;
  ostream *poVar5;
  reference pbVar6;
  bool bVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6b8;
  iterator oi_1;
  cmMakefile *mf;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_688;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_680;
  iterator oi;
  undefined1 local_658 [8];
  string obj_dir;
  string local_630;
  undefined1 local_610 [8];
  string suffix;
  char *imp;
  char *loc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string local_5a8;
  undefined1 local_588 [8];
  ostringstream e_2;
  string local_410 [8];
  string reason;
  cmGlobalGenerator *gg;
  string local_3c8;
  undefined1 local_3a8 [8];
  ostringstream e_1;
  string local_228;
  string local_208;
  undefined1 local_1e8 [8];
  ostringstream e;
  cmGeneratorTarget *gt;
  string tgtName;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetObjectsNode *this_local;
  
  tgtName.field_2._8_8_ = param_4;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(parameters);
  std::__cxx11::string::string((string *)&gt,(string *)pvVar4);
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,(string *)&gt);
  if (this_01 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    poVar5 = std::operator<<((ostream *)local_1e8,"Objects of target \"");
    poVar5 = std::operator<<(poVar5,(string *)&gt);
    std::operator<<(poVar5,"\" referenced but no such target exists.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_208,content);
    std::__cxx11::ostringstream::str();
    reportError(context,&local_208,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  }
  else {
    TVar3 = cmGeneratorTarget::GetType(this_01);
    if (TVar3 == OBJECT_LIBRARY) {
      if ((context->EvaluateForBuildsystem & 1U) == 0) {
        reason.field_2._8_8_ = cmLocalGenerator::GetGlobalGenerator(context->LG);
        std::__cxx11::string::string(local_410);
        bVar2 = (**(code **)(*(long *)reason.field_2._8_8_ + 0x100))(reason.field_2._8_8_,local_410)
        ;
        bVar7 = (bVar2 & 1) == 0;
        if (bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
          poVar5 = std::operator<<((ostream *)local_588,
                                   "The evaluation of the TARGET_OBJECTS generator expression is only suitable for consumption by CMake (limited"
                                  );
          poVar5 = std::operator<<(poVar5,local_410);
          std::operator<<(poVar5,").  It is not suitable for writing out elsewhere.");
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_5a8,content);
          std::__cxx11::ostringstream::str();
          reportError(context,&local_5a8,
                      (string *)
                      &objects.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &objects.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
        }
        std::__cxx11::string::~string(local_410);
        if (bVar7) goto LAB_008473c0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&loc);
      bVar7 = cmGeneratorTarget::IsImported(this_01);
      if (bVar7) {
        imp = (char *)0x0;
        suffix.field_2._8_8_ = 0;
        std::__cxx11::string::string((string *)local_610);
        bVar7 = cmTarget::GetMappedConfig
                          (this_01->Target,&context->Config,&imp,
                           (char **)((long)&suffix.field_2 + 8),(string *)local_610);
        pcVar1 = imp;
        if (bVar7) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_630,pcVar1,(allocator *)(obj_dir.field_2._M_local_buf + 0xf));
          cmSystemTools::ExpandListArgument
                    (&local_630,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&loc,false);
          std::__cxx11::string::~string((string *)&local_630);
          std::allocator<char>::~allocator((allocator<char> *)(obj_dir.field_2._M_local_buf + 0xf));
        }
        context->HadContextSensitiveCondition = true;
        std::__cxx11::string::~string((string *)local_610);
      }
      else {
        cmGeneratorTarget::GetTargetObjectNames
                  (this_01,&context->Config,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&loc);
        std::__cxx11::string::string((string *)local_658);
        if ((context->EvaluateForBuildsystem & 1U) == 0) {
          cmGeneratorTarget::GetObjectDirectory((string *)&oi,this_01,&context->Config);
          std::__cxx11::string::operator=((string *)local_658,(string *)&oi);
          std::__cxx11::string::~string((string *)&oi);
          context->HadContextSensitiveCondition = true;
        }
        else {
          std::__cxx11::string::operator=((string *)local_658,(string *)&this_01->ObjectDirectory);
        }
        local_680._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&loc);
        while( true ) {
          local_688._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&loc);
          bVar7 = __gnu_cxx::operator!=(&local_680,&local_688);
          if (!bVar7) break;
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_680);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mf,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_658,pbVar6);
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_680);
          std::__cxx11::string::operator=((string *)pbVar6,(string *)&mf);
          std::__cxx11::string::~string((string *)&mf);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_680);
        }
        std::__cxx11::string::~string((string *)local_658);
      }
      oi_1._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmLocalGenerator::GetMakefile(context->LG);
      local_6b8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&loc);
      while( true ) {
        local_6c0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&loc);
        bVar7 = __gnu_cxx::operator!=(&local_6b8,&local_6c0);
        this_00 = oi_1;
        if (!bVar7) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_6b8);
        cmMakefile::AddTargetObject((cmMakefile *)this_00._M_current,(string *)&gt,pbVar6);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_6b8);
      }
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&loc,";");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&loc);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
      poVar5 = std::operator<<((ostream *)local_3a8,"Objects of target \"");
      poVar5 = std::operator<<(poVar5,(string *)&gt);
      std::operator<<(poVar5,"\" referenced but is not an OBJECT library.");
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_3c8,content);
      std::__cxx11::ostringstream::str();
      reportError(context,&local_3c8,(string *)&gg);
      std::__cxx11::string::~string((string *)&gg);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
    }
  }
LAB_008473c0:
  std::__cxx11::string::~string((string *)&gt);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* /*dagChecker*/) const
    CM_OVERRIDE
  {
    std::string tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    if (gt->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not an OBJECT library.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    if (!context->EvaluateForBuildsystem) {
      cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
      std::string reason;
      if (!gg->HasKnownObjectFileLocation(&reason)) {
        std::ostringstream e;
        e << "The evaluation of the TARGET_OBJECTS generator expression "
             "is only suitable for consumption by CMake (limited"
          << reason << ").  "
                       "It is not suitable for writing out elsewhere.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
    }

    std::vector<std::string> objects;

    if (gt->IsImported()) {
      const char* loc = CM_NULLPTR;
      const char* imp = CM_NULLPTR;
      std::string suffix;
      if (gt->Target->GetMappedConfig(context->Config, &loc, &imp, suffix)) {
        cmSystemTools::ExpandListArgument(loc, objects);
      }
      context->HadContextSensitiveCondition = true;
    } else {
      gt->GetTargetObjectNames(context->Config, objects);

      std::string obj_dir;
      if (context->EvaluateForBuildsystem) {
        // Use object file directory with buildsystem placeholder.
        obj_dir = gt->ObjectDirectory;
        // Here we assume that the set of object files produced
        // by an object library does not vary with configuration
        // and do not set HadContextSensitiveCondition to true.
      } else {
        // Use object file directory with per-config location.
        obj_dir = gt->GetObjectDirectory(context->Config);
        context->HadContextSensitiveCondition = true;
      }

      for (std::vector<std::string>::iterator oi = objects.begin();
           oi != objects.end(); ++oi) {
        *oi = obj_dir + *oi;
      }
    }

    // Create the cmSourceFile instances in the referencing directory.
    cmMakefile* mf = context->LG->GetMakefile();
    for (std::vector<std::string>::iterator oi = objects.begin();
         oi != objects.end(); ++oi) {
      mf->AddTargetObject(tgtName, *oi);
    }

    return cmJoin(objects, ";");
  }